

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_fexdo_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int32_t *piVar1;
  float_status *status_00;
  fpr_t *pfVar2;
  long lVar3;
  long lVar4;
  float16 fVar5;
  float32 fVar6;
  uint uVar7;
  undefined4 in_register_00000014;
  float_status *pfVar8;
  float_status *extraout_RDX;
  float_status *extraout_RDX_00;
  float_status *extraout_RDX_01;
  float_status *extraout_RDX_02;
  wr_t *pwx;
  long lVar9;
  float_status *status;
  ulong uVar10;
  wr_t wx;
  float64 local_48;
  float64 fStack_40;
  uint32_t local_34;
  
  pfVar8 = (float_status *)CONCAT44(in_register_00000014,wd);
  lVar3 = (ulong)ws * 0x10 + 0x338;
  lVar4 = (ulong)wt * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  local_34 = wd;
  if (df == 2) {
    status_00 = &(env->active_tc).msa_fp_status;
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar5 = float16_from_float32
                        (*(int32_t *)((long)(env->active_fpu).fpr + lVar9 * 4 + lVar3 + -0x338),
                         (flag)status_00,pfVar8);
      *(float16 *)((long)&fStack_40 + lVar9 * 2) = fVar5;
      uVar7 = update_msacsr(env,0,0);
      pfVar8 = extraout_RDX;
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar7) != 0) {
        fVar5 = float16_default_nan_mips64(status_00);
        *(float16 *)((long)&fStack_40 + lVar9 * 2) = fVar5 & 0xffc0 ^ 0x200 | (ushort)uVar7;
        pfVar8 = extraout_RDX_00;
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar5 = float16_from_float32
                        (*(int32_t *)((long)(env->active_fpu).fpr + lVar9 * 4 + lVar4 + -0x338),
                         (flag)status_00,pfVar8);
      *(float16 *)((long)&local_48 + lVar9 * 2) = fVar5;
      uVar7 = update_msacsr(env,0,0);
      pfVar8 = extraout_RDX_01;
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar7) != 0) {
        fVar5 = float16_default_nan_mips64(status_00);
        *(float16 *)((long)&local_48 + lVar9 * 2) = fVar5 & 0xffc0 ^ 0x200 | (ushort)uVar7;
        pfVar8 = extraout_RDX_02;
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x19bc,
                    "void helper_msa_fexdo_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar8 = &(env->active_tc).msa_fp_status;
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 4) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar6 = float32_from_float64
                        (*(int64_t *)((long)(env->active_fpu).fpr + lVar9 * 2 + lVar3 + -0x338),
                         pfVar8);
      *(float32 *)((long)&fStack_40 + lVar9) = fVar6;
      uVar7 = update_msacsr(env,0,(uint)((fVar6 & 0x7f800000) == 0 && (fVar6 & 0x7fffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar7) != 0) {
        fVar6 = float32_default_nan_mips64(pfVar8);
        *(float32 *)((long)&fStack_40 + lVar9) = fVar6 & 0xffffffc0 ^ 0x400000 | uVar7;
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar6 = float32_from_float64
                        (*(int64_t *)((long)(env->active_fpu).fpr + lVar9 * 2 + lVar4 + -0x338),
                         pfVar8);
      *(float32 *)((long)&local_48 + lVar9) = fVar6;
      uVar7 = update_msacsr(env,0,(uint)((fVar6 & 0x7f800000) == 0 && (fVar6 & 0x7fffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar7) != 0) {
        fVar6 = float32_default_nan_mips64(pfVar8);
        *(float32 *)((long)&local_48 + lVar9) = fVar6 & 0xffffffc0 ^ 0x400000 | uVar7;
      }
    }
  }
  uVar10 = (ulong)local_34;
  check_msacsr_cause(env,wx.d[0]);
  pfVar2 = (env->active_fpu).fpr + uVar10;
  pfVar2->fd = local_48;
  (&pfVar2->fd)[1] = fStack_40;
  return;
}

Assistant:

void helper_msa_fexdo_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                         uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            /*
             * Half precision floats come in two formats: standard
             * IEEE and "ARM" format.  The latter gains extra exponent
             * range by omitting the NaN/Inf encodings.
             */
            flag ieee = 1;

            MSA_FLOAT_BINOP(Lh(pwx, i), from_float32, pws->w[i], ieee, 16);
            MSA_FLOAT_BINOP(Rh(pwx, i), from_float32, pwt->w[i], ieee, 16);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(Lw(pwx, i), from_float64, pws->d[i], 32);
            MSA_FLOAT_UNOP(Rw(pwx, i), from_float64, pwt->d[i], 32);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());
    msa_move_v(pwd, pwx);
}